

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O1

void file_uncompress(char *file)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  gzFile pgVar4;
  FILE *pFVar5;
  char *pcVar6;
  char *in_RSI;
  char *pcVar7;
  gzFile unaff_R12;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  char *unaff_R14;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  char buf [1024];
  undefined4 uStack_470;
  undefined1 uStack_46c;
  char *pcStack_458;
  gzFile pgStack_450;
  ulong uStack_448;
  char *pcStack_440;
  char *pcStack_438;
  char acStack_428 [1024];
  
  pcVar12 = acStack_428;
  pcVar3 = (char *)strlen(file);
  uVar9 = (ulong)pcVar3 & 0xffffffff;
  if (uVar9 < 0x3fd) {
    unaff_R12 = (gzFile)0x400;
    snprintf(acStack_428,0x400,"%s",file);
    if (((uint)pcVar3 < 4) || (iVar1 = strcmp(file + (uVar9 - 3),".gz"), iVar1 != 0)) {
      unaff_R12 = (gzFile)(0x400 - uVar9);
      snprintf(acStack_428 + uVar9,(size_t)unaff_R12,"%s",".gz");
      unaff_R14 = acStack_428;
      pcVar12 = file;
    }
    else {
      acStack_428[(uint)pcVar3 - 3] = '\0';
      unaff_R14 = file;
    }
    in_RSI = "rb";
    pgVar4 = (gzFile)gzopen(unaff_R14);
    pcVar3 = pcVar12;
    if (pgVar4 == (gzFile)0x0) goto LAB_001017f3;
    in_RSI = "wb";
    pFVar5 = fopen(pcVar12,"wb");
    if (pFVar5 != (FILE *)0x0) {
      gz_uncompress(pgVar4,(FILE *)pFVar5);
      unlink(unaff_R14);
      return;
    }
  }
  else {
    file_uncompress_cold_3();
LAB_001017f3:
    pgVar4 = unaff_R12;
    file_uncompress_cold_2();
  }
  pcVar7 = file;
  file_uncompress_cold_1();
  uVar11 = (ulong)pcVar7 & 0xffffffff;
  uStack_46c = 0;
  uStack_470 = 0x20366277;
  pcVar12 = *(char **)in_RSI;
  prog = pcVar12;
  pcStack_458 = file;
  pgStack_450 = pgVar4;
  uStack_448 = uVar9;
  pcStack_440 = unaff_R14;
  pcStack_438 = pcVar3;
  pcVar6 = strrchr(pcVar12,0x2f);
  pcVar3 = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    pcVar3 = pcVar12;
  }
  iVar1 = strcmp(pcVar3,"gunzip");
  if (iVar1 == 0) {
    bVar13 = true;
    bVar8 = false;
  }
  else {
    iVar1 = strcmp(pcVar3,"zcat");
    bVar13 = iVar1 == 0;
    bVar8 = bVar13;
  }
  in_RSI = in_RSI + 8;
  iVar1 = (int)pcVar7 + -1;
  if (1 < (int)pcVar7) {
    do {
      pcVar12 = *(char **)in_RSI;
      iVar2 = strcmp(pcVar12,"-c");
      if (iVar2 == 0) {
        bVar8 = true;
      }
      else {
        iVar2 = strcmp(pcVar12,"-d");
        if (iVar2 == 0) {
          bVar13 = true;
        }
        else {
          iVar2 = strcmp(pcVar12,"-f");
          if (iVar2 == 0) {
            uStack_470 = CONCAT13(0x66,(undefined3)uStack_470);
          }
          else {
            iVar2 = strcmp(pcVar12,"-h");
            if (iVar2 == 0) {
              uStack_470 = CONCAT13(0x68,(undefined3)uStack_470);
            }
            else {
              iVar2 = strcmp(pcVar12,"-r");
              if (iVar2 == 0) {
                uStack_470 = CONCAT13(0x52,(undefined3)uStack_470);
              }
              else {
                if (*pcVar12 != '-') {
                  iVar1 = (int)uVar11 + -1;
                  goto LAB_0010195d;
                }
                if ((8 < (byte)(pcVar12[1] - 0x31U)) || (pcVar12[2] != '\0')) goto LAB_0010195d;
                uStack_470._0_3_ = CONCAT12(pcVar12[1],(undefined2)uStack_470);
              }
            }
          }
        }
      }
      in_RSI = in_RSI + 8;
      iVar1 = iVar1 + -1;
      uVar10 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar10;
    } while (1 < (int)uVar10);
    iVar1 = 0;
  }
LAB_0010195d:
  if (uStack_470._3_1_ == ' ') {
    uStack_470 = uStack_470 & 0xffffff;
  }
  if (iVar1 == 0) {
    if (bVar13) {
      iVar1 = fileno(_stdin);
      pgVar4 = (gzFile)gzdopen(iVar1,"rb");
      if (pgVar4 == (gzFile)0x0) {
LAB_00101abc:
        main_cold_3();
LAB_00101ac1:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar4,(FILE *)_stdout);
    }
    else {
      iVar1 = fileno(_stdout);
      pgVar4 = (gzFile)gzdopen(iVar1,&uStack_470);
      if (pgVar4 == (gzFile)0x0) goto LAB_00101ac1;
      gz_compress((FILE *)_stdin,pgVar4);
    }
  }
  else {
    do {
      pcVar12 = *(char **)in_RSI;
      if (bVar13) {
        if (bVar8) {
          pgVar4 = (gzFile)gzopen(pcVar12,"rb");
          if (pgVar4 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar4,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar12);
        }
      }
      else if (bVar8) {
        pFVar5 = fopen(pcVar12,"rb");
        if (pFVar5 == (FILE *)0x0) {
          perror(*(char **)in_RSI);
        }
        else {
          iVar2 = fileno(_stdout);
          pgVar4 = (gzFile)gzdopen(iVar2,&uStack_470);
          if (pgVar4 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101abc;
          }
          gz_compress((FILE *)pFVar5,pgVar4);
        }
      }
      else {
        file_compress(pcVar12,(char *)&uStack_470);
      }
      in_RSI = in_RSI + 8;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void file_uncompress(file)
    char  *file;
{
    local char buf[MAX_NAME_LEN];
    char *infile, *outfile;
    FILE  *out;
    gzFile in;
    unsigned len = strlen(file);

    if (len + strlen(GZ_SUFFIX) >= sizeof(buf)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(buf, sizeof(buf), "%s", file);
#else
    strcpy(buf, file);
#endif

    if (len > SUFFIX_LEN && strcmp(file+len-SUFFIX_LEN, GZ_SUFFIX) == 0) {
        infile = file;
        outfile = buf;
        outfile[len-3] = '\0';
    } else {
        outfile = file;
        infile = buf;
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
        snprintf(buf + len, sizeof(buf) - len, "%s", GZ_SUFFIX);
#else
        strcat(infile, GZ_SUFFIX);
#endif
    }
    in = gzopen(infile, "rb");
    if (in == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, infile);
        exit(1);
    }
    out = fopen(outfile, "wb");
    if (out == NULL) {
        perror(file);
        exit(1);
    }

    gz_uncompress(in, out);

    unlink(infile);
}